

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

void __thiscall ConstantExpression::set(ConstantExpression *this,string *str)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_28;
  char c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  const_iterator i;
  string *str_local;
  ConstantExpression *this_local;
  
  i._M_current = (char *)str;
  std::__cxx11::string::clear();
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)&this->m_text);
  std::__cxx11::string::operator+=((string *)&this->m_text,'\"');
  local_20._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    _Stack_28._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    cVar3 = *pcVar4;
    if (cVar3 == '\a') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\a");
    }
    else if (cVar3 == '\t') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\t");
    }
    else if (cVar3 == '\n') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\n");
    }
    else if (cVar3 == '\v') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\v");
    }
    else if (cVar3 == '\r') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\r");
    }
    else if (cVar3 == '\"') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\\"");
    }
    else if (cVar3 == '\'') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\\'");
    }
    else if (cVar3 == '\\') {
      std::__cxx11::string::operator+=((string *)&this->m_text,"\\\\");
    }
    else {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      cVar3 = *pcVar4;
      if ((cVar3 < ' ') || ('~' < cVar3)) {
        std::__cxx11::string::operator+=((string *)&this->m_text,"\\x00");
        cVar2 = ToHex(this,(int)cVar3 >> 4 & 0xf);
        std::__cxx11::string::operator+=((string *)&this->m_text,cVar2);
        cVar3 = ToHex(this,(int)cVar3 & 0xf);
        std::__cxx11::string::operator+=((string *)&this->m_text,cVar3);
      }
      else {
        std::__cxx11::string::operator+=((string *)&this->m_text,cVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  std::__cxx11::string::operator+=((string *)&this->m_text,'\"');
  this->m_isLiteral = true;
  return;
}

Assistant:

void set( const std::string& str )
	{
		m_text.clear();
		m_text.reserve(str.size() + 2);

		m_text += '\"';
		for( basic_string <char>::const_iterator i = str.begin(); i != str.end(); ++i)
		{
			switch(*i)
			{
				case '\"':	m_text += "\\\"";			break;
				case '\'':	m_text += "\\\'";			break;
				case '\r':	m_text += "\\r";			break;
				case '\n':	m_text += "\\n";			break;
				case '\t':	m_text += "\\t";			break;
				case '\v':	m_text += "\\v";			break;
				case '\a':	m_text += "\\a";			break;
				case '\\':	m_text += "\\\\";			break;
			
				default:
					{
						const char c = *i;

						if (c < 0x20 || c > 0x7e)
						{
							m_text += "\\x00";
							m_text += ToHex((c >> 4) & 0x0f);
							m_text += ToHex(c & 0x0f);
						}
						else
						{
							m_text += c;
						}
					}
					break;
			}
		}
		m_text += '\"';

		m_isLiteral = true;
	}